

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstreams.cpp
# Opt level: O0

ssize_t __thiscall HPack::BitIStream::read(BitIStream *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  uint uVar2;
  QMessageLogger *pQVar3;
  ulong uVar4;
  quint64 qVar5;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  uchar octet;
  quint32 octetPower;
  quint64 val;
  quint32 newOffset;
  uchar prefix;
  quint32 fullPrefix;
  quint32 prefixLen;
  quint32 *dst;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  QMessageLogger *this_00;
  int local_64;
  uint local_58;
  undefined1 local_29;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMessageLogger *)this->offset;
  pQVar3 = (QMessageLogger *)bitLength(this);
  if (this_00 < pQVar3) {
    setError(this,NoError);
    local_58 = 8 - ((uint)this->offset & 7);
    uVar2 = (1 << ((byte)local_58 & 0x1f)) - 1;
    bVar1 = this->first[this->offset >> 3] & (byte)uVar2;
    if (bVar1 < uVar2) {
      *(uint *)CONCAT44(in_register_00000034,__fd) = (uint)bVar1;
      this->offset = (ulong)local_58 + this->offset;
      local_29 = 1;
    }
    else {
      local_58 = (int)this->offset + local_58;
      uVar2 = (uint)bVar1;
      local_64 = 0;
      while( true ) {
        uVar4 = (ulong)local_58;
        qVar5 = bitLength(this);
        if (qVar5 <= uVar4) break;
        bVar1 = this->first[local_58 >> 3];
        if ((local_64 == 0x1c) && (0xf < bVar1)) {
          QMessageLogger::QMessageLogger
                    (this_00,(char *)this,(int)(uVar4 >> 0x20),
                     (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
          QMessageLogger::critical(local_28,"integer is too big");
          setError(this,InvalidInteger);
          local_29 = 0;
          goto LAB_0028dbac;
        }
        uVar2 = ((bVar1 & 0x7f) << ((byte)local_64 & 0x1f)) + uVar2;
        local_58 = local_58 + 8;
        if ((bVar1 & 0x80) == 0) {
          *(uint *)CONCAT44(in_register_00000034,__fd) = uVar2;
          this->offset = (ulong)local_58;
          local_29 = 1;
          goto LAB_0028dbac;
        }
        local_64 = local_64 + 7;
      }
      setError(this,NotEnoughData);
      local_29 = 0;
    }
  }
  else {
    setError(this,NotEnoughData);
    local_29 = 0;
  }
LAB_0028dbac:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_29);
  }
  __stack_chk_fail();
}

Assistant:

bool BitIStream::read(quint32 *dstPtr)
{
    Q_ASSERT(dstPtr);
    quint32 &dst = *dstPtr;

    // 5.1 Integer Representation
    //
    // Integers are used to represent name indexes, header field indexes, or string lengths.
    // An integer representation can start anywhere within an octet.
    // To allow for optimized processing, an integer representation always finishes at the end of an octet.
    // An integer is represented in two parts: a prefix that fills the current octet and an optional
    // list of octets that are used if the integer value does not fit within the prefix.
    // The number of bits of the prefix (called N) is a parameter of the integer representation.
    // If the integer value is small enough, i.e., strictly less than 2N-1, it is compressed within the N-bit prefix.
    // ...
    // The prefix size, N, is always between 1 and 8 bits. An integer
    // starting at an octet boundary will have an 8-bit prefix.

    // Technically, such integers can be of any size, but as we do not have arbitrary-long integers,
    // everything that does not fit into 'dst' we consider as an error (after all, try to allocate a string
    // of such size and ... hehehe - send it as a part of a header!

    // This function updates the offset _only_ if the read was successful.
    if (offset >= bitLength()) {
        setError(Error::NotEnoughData);
        return false;
    }

    setError(Error::NoError);

    const quint32 prefixLen = 8 - offset % 8;
    const quint32 fullPrefix = (1 << prefixLen) - 1;

    const uchar prefix = uchar(first[offset / 8] & fullPrefix);
    if (prefix < fullPrefix) {
        // The number fitted into the prefix bits.
        dst = prefix;
        offset += prefixLen;
        return true;
    }

    quint32 newOffset = offset + prefixLen;
    // We have a list of bytes representing an integer ...
    quint64 val = prefix;
    quint32 octetPower = 0;

    while (true) {
        if (newOffset >= bitLength()) {
            setError(Error::NotEnoughData);
            return false;
        }

        const uchar octet = first[newOffset / 8];

        if (octetPower == 28 && octet > 15) {
            qCritical("integer is too big");
            setError(Error::InvalidInteger);
            return false;
        }

        val += quint32(octet & 0x7f) << octetPower;
        newOffset += 8;

        if (!(octet & 0x80)) {
            // The most significant bit of each octet is used
            // as a continuation flag: its value is set to 1
            // except for the last octet in the list.
            break;
        }

        octetPower += 7;
    }

    dst = val;
    offset = newOffset;
    Q_ASSERT(!(offset % 8));

    return true;
}